

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapsingHeader(char *label,bool *p_visible,ImGuiTreeNodeFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  byte *in_RSI;
  float _x;
  ImGuiID close_button_id;
  float button_y;
  float button_x;
  float button_size;
  ImGuiLastItemDataBackup last_item_backup;
  ImGuiContext *g;
  bool is_open;
  ImGuiID id;
  ImGuiWindow *window;
  ImVec2 *in_stack_00000098;
  ImGuiID in_stack_000000a0;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  ImGuiTreeNodeFlags in_stack_000000dc;
  ImGuiID in_stack_000000e0;
  undefined4 in_stack_ffffffffffffff80;
  ImGuiID in_stack_ffffffffffffff84;
  ImVec2 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ImGuiWindow *in_stack_ffffffffffffffa0;
  bool local_1;
  
  pIVar4 = GetCurrentWindow();
  if ((pIVar4->SkipItems & 1U) == 0) {
    if ((in_RSI == (byte *)0x0) || ((*in_RSI & 1) != 0)) {
      ImGuiWindow::GetID(in_stack_ffffffffffffffa0,
                         (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_1 = TreeNodeBehavior(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0,
                                 in_stack_000000c8);
      pIVar1 = GImGui;
      if (in_RSI != (byte *)0x0) {
        ImGuiLastItemDataBackup::ImGuiLastItemDataBackup
                  ((ImGuiLastItemDataBackup *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        fVar3 = -(pIVar1->Style).FramePadding.x;
        _x = ImMax<float>((pIVar4->DC).LastItemRect.Min.x,
                          (fVar3 + fVar3 + (pIVar4->DC).LastItemRect.Max.x) - pIVar1->FontSize);
        fVar3 = (pIVar4->DC).LastItemRect.Min.y;
        GetIDWithSeed((char *)CONCAT44(fVar3,in_stack_ffffffffffffff90),
                      (char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,_x,fVar3);
        bVar2 = CloseButton(in_stack_000000a0,in_stack_00000098);
        if (bVar2) {
          *in_RSI = 0;
        }
        ImGuiLastItemDataBackup::Restore((ImGuiLastItemDataBackup *)&stack0xffffffffffffffa0);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::CollapsingHeader(const char* label, bool* p_visible, ImGuiTreeNodeFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    if (p_visible && !*p_visible)
        return false;

    ImGuiID id = window->GetID(label);
    flags |= ImGuiTreeNodeFlags_CollapsingHeader;
    if (p_visible)
        flags |= ImGuiTreeNodeFlags_AllowItemOverlap | ImGuiTreeNodeFlags_ClipLabelForTrailingButton;
    bool is_open = TreeNodeBehavior(id, flags, label);
    if (p_visible != NULL)
    {
        // Create a small overlapping close button
        // FIXME: We can evolve this into user accessible helpers to add extra buttons on title bars, headers, etc.
        // FIXME: CloseButton can overlap into text, need find a way to clip the text somehow.
        ImGuiContext& g = *GImGui;
        ImGuiLastItemDataBackup last_item_backup;
        float button_size = g.FontSize;
        float button_x = ImMax(window->DC.LastItemRect.Min.x, window->DC.LastItemRect.Max.x - g.Style.FramePadding.x * 2.0f - button_size);
        float button_y = window->DC.LastItemRect.Min.y;
        ImGuiID close_button_id = GetIDWithSeed("#CLOSE", NULL, id);
        if (CloseButton(close_button_id, ImVec2(button_x, button_y)))
            *p_visible = false;
        last_item_backup.Restore();
    }

    return is_open;
}